

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O0

void highbd_dc_predictor_rect
               (uint16_t *dst,ptrdiff_t stride,int bw,int bh,uint16_t *above,uint16_t *left,int bd,
               int shift1,uint32_t multiplier)

{
  int val;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  void *in_RDI;
  long in_R8;
  long in_R9;
  int r;
  int expected_dc;
  int i_1;
  int i;
  int sum;
  undefined4 local_3c;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined8 local_8;
  
  local_2c = 0;
  for (local_30 = 0; local_30 < in_EDX; local_30 = local_30 + 1) {
    local_2c = (uint)*(ushort *)(in_R8 + (long)local_30 * 2) + local_2c;
  }
  for (local_34 = 0; local_34 < in_ECX; local_34 = local_34 + 1) {
    local_2c = (uint)*(ushort *)(in_R9 + (long)local_34 * 2) + local_2c;
  }
  val = divide_using_multiply_shift(local_2c + (in_EDX + in_ECX >> 1),expected_dc,i,0x11);
  local_8 = in_RDI;
  for (local_3c = 0; local_3c < in_ECX; local_3c = local_3c + 1) {
    aom_memset16(local_8,val,(long)in_EDX);
    local_8 = (void *)(in_RSI * 2 + (long)local_8);
  }
  return;
}

Assistant:

static inline void highbd_dc_predictor_rect(uint16_t *dst, ptrdiff_t stride,
                                            int bw, int bh,
                                            const uint16_t *above,
                                            const uint16_t *left, int bd,
                                            int shift1, uint32_t multiplier) {
  int sum = 0;
  (void)bd;

  for (int i = 0; i < bw; i++) {
    sum += above[i];
  }
  for (int i = 0; i < bh; i++) {
    sum += left[i];
  }

  const int expected_dc = divide_using_multiply_shift(
      sum + ((bw + bh) >> 1), shift1, multiplier, HIGHBD_DC_SHIFT2);
  assert(expected_dc < (1 << bd));

  for (int r = 0; r < bh; r++) {
    aom_memset16(dst, expected_dc, bw);
    dst += stride;
  }
}